

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseLocator_test.cpp
# Opt level: O0

void __thiscall
test::external_definition_not_found::test_method(external_definition_not_found *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  lazy_ostream *plVar3;
  AuditEvent *pAVar4;
  basic_cstring<const_char> local_1298;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[15],_const_char_(&)[15]> local_1288;
  assertion_result local_1268;
  basic_cstring<const_char> local_1250;
  basic_cstring<const_char> local_1240;
  size_type local_1230;
  undefined4 local_1224;
  basic_cstring<const_char> local_1220;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1210;
  basic_cstring<const_char> local_11e8;
  basic_cstring<const_char> local_11d8;
  basic_cstring<const_char> local_11c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[15],_const_char_(&)[15]> local_11b8;
  assertion_result local_1198;
  basic_cstring<const_char> local_1180;
  basic_cstring<const_char> local_1170;
  basic_cstring<const_char> local_1160;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[38],_const_char_(&)[38]> local_1150;
  assertion_result local_1130;
  basic_cstring<const_char> local_1118;
  basic_cstring<const_char> local_1108;
  undefined1 local_10f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  licenseInfos;
  ExternalDefinition externalDefinition;
  undefined1 local_109c [8];
  LicenseLocation licLocation;
  EventRegistry registry;
  allocator local_31;
  string local_30 [8];
  string applicationDefinedString;
  external_definition_not_found *this_local;
  
  applicationDefinedString.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/this/file/doesnt/exist"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  license::EventRegistry::EventRegistry((EventRegistry *)(licLocation.licenseData + 0xff8));
  memset(local_109c,0,0x1004);
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  std::copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char*>
            (__first,__last,local_109c + 4);
  license::locate::ExternalDefinition::ExternalDefinition
            ((ExternalDefinition *)
             &licenseInfos.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(LicenseLocation *)local_109c);
  license::locate::ExternalDefinition::license_locations_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_10f8,
             (ExternalDefinition *)
             &licenseInfos.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (EventRegistry *)(licLocation.licenseData + 0xff8));
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
               ,0x7d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1118);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1108,0x79,&local_1118);
    bVar2 = license::EventRegistry::isGood((EventRegistry *)(licLocation.licenseData + 0xff8));
    boost::test_tools::assertion_result::assertion_result(&local_1130,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              (&local_1150,plVar3,(char (*) [38])"No fatal error for now, only warnings");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1160,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
               ,0x7d);
    boost::test_tools::tt_detail::report_assertion(&local_1130,&local_1150,&local_1160,0x79,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[38],_const_char_(&)[38]>::
    ~lazy_ostream_impl(&local_1150);
    boost::test_tools::assertion_result::~assertion_result(&local_1130);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  license::EventRegistry::turnWarningsIntoErrors((EventRegistry *)(licLocation.licenseData + 0xff8))
  ;
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1170,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
               ,0x7d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1180);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1170,0x7b,&local_1180);
    bVar2 = license::EventRegistry::isGood((EventRegistry *)(licLocation.licenseData + 0xff8));
    boost::test_tools::assertion_result::assertion_result(&local_1198,(bool)(~bVar2 & 1));
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_11b8,plVar3,(char (*) [15])"Error detected");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
               ,0x7d);
    boost::test_tools::tt_detail::report_assertion(&local_1198,&local_11b8,&local_11c8,0x7b,2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[15],_const_char_(&)[15]>::
    ~lazy_ostream_impl(&local_11b8);
    boost::test_tools::assertion_result::~assertion_result(&local_1198);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
               ,0x7d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_11e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_11d8,0x7c,&local_11e8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1210,plVar3,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1220,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
               ,0x7d);
    local_1224 = 0;
    local_1230 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_10f8);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_long>
              (&local_1210,&local_1220,0x7c,1,2,&local_1224,"0",&local_1230,"licenseInfos.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1210);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1240,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
               ,0x7d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1250);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1240,0x7d,&local_1250);
    pAVar4 = license::EventRegistry::getLastFailure
                       ((EventRegistry *)(licLocation.licenseData + 0xff8));
    boost::test_tools::assertion_result::assertion_result
              (&local_1268,pAVar4->event_type == LICENSE_FILE_NOT_FOUND);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1288,plVar3,(char (*) [15])"Error detected");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1298,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
               ,0x7d);
    boost::test_tools::tt_detail::report_assertion(&local_1268,&local_1288,&local_1298,0x7d,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[15],_const_char_(&)[15]>::
    ~lazy_ostream_impl(&local_1288);
    boost::test_tools::assertion_result::~assertion_result(&local_1268);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_10f8);
  license::locate::ExternalDefinition::~ExternalDefinition
            ((ExternalDefinition *)
             &licenseInfos.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  license::EventRegistry::~EventRegistry((EventRegistry *)(licLocation.licenseData + 0xff8));
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(external_definition_not_found) {
	string applicationDefinedString = PROJECT_TEST_SRC_DIR "/this/file/doesnt/exist";
	license::EventRegistry registry;
	LicenseLocation licLocation = {LICENSE_PATH};
	std::copy(applicationDefinedString.begin(), applicationDefinedString.end(), licLocation.licenseData);
	ExternalDefinition externalDefinition(&licLocation);
	vector<string> licenseInfos = externalDefinition.license_locations(registry);

	BOOST_CHECK_MESSAGE(registry.isGood(), "No fatal error for now, only warnings");
	registry.turnWarningsIntoErrors();
	BOOST_REQUIRE_MESSAGE(!registry.isGood(), "Error detected");
	BOOST_CHECK_EQUAL(0, licenseInfos.size());
	BOOST_CHECK_MESSAGE(registry.getLastFailure()->event_type == LICENSE_FILE_NOT_FOUND, "Error detected");
}